

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O2

void __thiscall Memory::MarkContext::ProcessTracked(MarkContext *this)

{
  PageStack<FinalizableObject_*> *this_00;
  code *pcVar1;
  bool bVar2;
  FinalizableObject *in_RAX;
  undefined4 *puVar3;
  FinalizableObject *local_28;
  FinalizableObject *trackedObject;
  
  this_00 = &this->trackStack;
  local_28 = in_RAX;
  bVar2 = PageStack<FinalizableObject_*>::IsEmpty(this_00);
  if (!bVar2) {
    while( true ) {
      bVar2 = PageStack<FinalizableObject_*>::Pop(this_00,&local_28);
      if (!bVar2) break;
      MarkTrackedObject(this,local_28);
    }
    bVar2 = PageStack<FinalizableObject_*>::IsEmpty(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.cpp"
                         ,0x82,"(trackStack.IsEmpty())","trackStack.IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    PageStack<FinalizableObject_*>::Release(this_00);
  }
  return;
}

Assistant:

void MarkContext::ProcessTracked()
{
    if (trackStack.IsEmpty())
    {
        return;
    }

    FinalizableObject * trackedObject;
    while (trackStack.Pop(&trackedObject))
    {
        MarkTrackedObject(trackedObject);
    }

    Assert(trackStack.IsEmpty());

    trackStack.Release();
}